

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

bool __thiscall
dg::vr::RelationsAnalyzer::mayHaveAlias(RelationsAnalyzer *this,ValueRelations *graph,V val)

{
  bool bVar1;
  reference ppVVar2;
  _Base_ptr in_RDX;
  _Base_ptr in_RSI;
  VectorSet<const_llvm::Value_*> *in_RDI;
  Value *eqval;
  iterator __end2;
  iterator __begin2;
  VectorSet<const_llvm::Value_*> *__range2;
  Value *in_stack_ffffffffffffffa0;
  int local_54;
  __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  local_48;
  V in_stack_ffffffffffffffd0;
  ValueRelations *in_stack_ffffffffffffffd8;
  ValueRelations *graph_00;
  byte local_1;
  
  ValueRelations::getEqual(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  graph_00 = (ValueRelations *)&stack0xffffffffffffffc0;
  local_48._M_current = (Value **)VectorSet<const_llvm::Value_*>::begin(in_RDI);
  VectorSet<const_llvm::Value_*>::end(in_RDI);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                        *)in_RDI);
    if (!bVar1) {
      local_54 = 2;
LAB_001cd15d:
      VectorSet<const_llvm::Value_*>::~VectorSet((VectorSet<const_llvm::Value_*> *)0x1cd167);
      if (local_54 != 1) {
        local_1 = 0;
      }
      return (bool)(local_1 & 1);
    }
    ppVVar2 = __gnu_cxx::
              __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
              ::operator*(&local_48);
    in_stack_ffffffffffffffa0 = *ppVVar2;
    bVar1 = hasKnownOrigin(graph_00,in_stack_ffffffffffffffd0);
    if ((!bVar1) || (bVar1 = mayHaveAlias((RelationsAnalyzer *)in_RSI,(V)in_RDX), bVar1)) {
      local_1 = 1;
      local_54 = 1;
      goto LAB_001cd15d;
    }
    __gnu_cxx::
    __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
    ::operator++(&local_48);
  } while( true );
}

Assistant:

bool RelationsAnalyzer::mayHaveAlias(const ValueRelations &graph, V val) const {
    for (const auto *eqval : graph.getEqual(val)) {
        if (!hasKnownOrigin(graph, eqval) || mayHaveAlias(eqval))
            return true;
    }
    return false;
}